

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  BasePort *this;
  ostream *poVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  uint32_t status;
  string portDescription;
  stringstream debugStream;
  ostream local_1a08 [376];
  ofstream outFile;
  int aiStack_1870 [120];
  AmpIO Board;
  uchar buffer [2048];
  
  BasePort::DefaultPort_abi_cxx11_();
  uVar9 = 0;
  uVar3 = uVar9;
  if (1 < argc) {
    uVar3 = 0;
    for (uVar8 = 1; (uint)argc != uVar8; uVar8 = uVar8 + 1) {
      pcVar7 = argv[uVar8];
      if (*pcVar7 == '-') {
        if (pcVar7[1] != 'p') {
          poVar6 = std::operator<<((ostream *)&std::cerr,"Usage: instrument <board-num> [-pP]");
          poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
          poVar6 = std::operator<<(poVar6,"       where <board-num> = rotary switch setting (0-15)")
          ;
          poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
          poVar6 = std::operator<<(poVar6,"             P = port number (default 0)");
          poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
          poVar6 = std::operator<<(poVar6,"       can also specify -pfwP, -pethP or -pudp");
          iVar4 = 0;
          std::endl<char,std::char_traits<char>>(poVar6);
          goto LAB_00104c90;
        }
        std::__cxx11::string::assign((char *)&portDescription);
      }
      else {
        if (uVar9 == 0) {
          uVar3 = atoi(pcVar7);
        }
        uVar9 = uVar9 + 1;
      }
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&debugStream,_S_out|_S_in);
  this = PortFactory(portDescription._M_dataplus._M_p,local_1a08);
  if (this == (BasePort *)0x0) {
    PrintDebugStream(&debugStream);
    poVar6 = std::operator<<((ostream *)&std::cerr,"Failed to create port using: ");
    poVar6 = std::operator<<(poVar6,(string *)&portDescription);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  else {
    iVar4 = (*this->_vptr_BasePort[0x11])(this);
    if ((char)iVar4 != '\0') {
      uVar9 = uVar3 & 0xff;
      AmpIO::AmpIO(&Board,(uint8_t)uVar3);
      (*this->_vptr_BasePort[0xd])(this);
      uVar5 = BoardIO::GetFirmwareVersion((BoardIO *)&Board);
      if (uVar5 < 7) {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "Instrument read requires firmware version 7+ (detected version ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6,")");
        std::endl<char,std::char_traits<char>>(poVar6);
        (*this->_vptr_BasePort[0xe])(this,(ulong)uVar9);
LAB_00104c6d:
        (*this->_vptr_BasePort[0xb])(this);
LAB_00104c76:
        iVar4 = -1;
      }
      else {
        status = BoardIO::ReadStatus((BoardIO *)&Board);
        bVar1 = AmpIO::DallasReadMemory(&Board,0,buffer,0x800);
        bVar2 = AmpIO::DallasReadStatus(&Board,&status);
        if (!bVar2) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"Failed to read DS2505 status");
          std::endl<char,std::char_traits<char>>(poVar6);
          (*this->_vptr_BasePort[0xe])(this,(ulong)uVar9);
          goto LAB_00104c6d;
        }
        (*this->_vptr_BasePort[0xe])(this,(ulong)uVar9);
        (*this->_vptr_BasePort[0xb])(this);
        uVar5 = status;
        if ((status & 1) == 0) {
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "DS2505 interface not enabled (hardware problem)");
          std::endl<char,std::char_traits<char>>(poVar6);
          goto LAB_00104c76;
        }
        uVar3 = status >> 1 & 3;
        if (uVar3 == 1) {
          if (status >> 0x18 == 0xb) {
            if (-1 < (short)status) {
              std::operator<<((ostream *)&std::cout,"Measured rise time: ");
              poVar6 = std::ostream::_M_insert<double>((double)(uVar5 >> 0x10 & 0xff) / 49.152);
              poVar6 = std::operator<<(poVar6," microseconds");
              std::endl<char,std::char_traits<char>>(poVar6);
            }
            if (bVar1) {
              std::ofstream::ofstream(&outFile,"instrument.txt",_S_bin);
              if (*(int *)((long)aiStack_1870 + *(long *)(_outFile + -0x18)) == 0) {
                std::ostream::write((char *)&outFile,(long)buffer);
                poVar6 = std::operator<<((ostream *)&std::cout,"Data written to instrument.txt");
                std::endl<char,std::char_traits<char>>(poVar6);
                iVar4 = 0;
                std::ofstream::close();
              }
              else {
                poVar6 = std::operator<<((ostream *)&std::cerr,
                                         "Failed to open instrument.txt for writing");
                std::endl<char,std::char_traits<char>>(poVar6);
                iVar4 = -1;
              }
              std::ofstream::~ofstream(&outFile);
              goto LAB_00104c79;
            }
            poVar6 = std::operator<<((ostream *)&std::cerr,"Failed to read instrument memory");
            std::endl<char,std::char_traits<char>>(poVar6);
          }
          else {
            poVar6 = std::operator<<((ostream *)&std::cerr,"Unknown device family code: 0x");
            *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
                 *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            poVar6 = std::operator<<(poVar6," (DS2505 should be 0x0B)");
            std::endl<char,std::char_traits<char>>(poVar6);
          }
          goto LAB_00104c76;
        }
        poVar6 = std::operator<<((ostream *)&std::cerr,"Failed to communicate with DS2505");
        std::endl<char,std::char_traits<char>>(poVar6);
        iVar4 = -1;
        if (uVar3 == 3) {
          pcVar7 = "  - Did not received ACK from DS2505 -- is dMIB signal jumpered?";
LAB_00104e02:
          poVar6 = std::operator<<((ostream *)&std::cerr,pcVar7);
          std::endl<char,std::char_traits<char>>(poVar6);
        }
        else if (uVar3 == 2) {
          pcVar7 = "  - DOUT3 did not reach high state -- is pullup resistor missing?";
          goto LAB_00104e02;
        }
      }
LAB_00104c79:
      AmpIO::~AmpIO(&Board);
      goto LAB_00104c86;
    }
    PrintDebugStream(&debugStream);
    poVar6 = std::operator<<((ostream *)&std::cerr,"Failed to initialize ");
    BasePort::GetPortTypeString_abi_cxx11_((string *)&Board,this);
    poVar6 = std::operator<<(poVar6,(string *)&Board);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::string::~string((string *)&Board);
  }
  iVar4 = -1;
LAB_00104c86:
  std::__cxx11::stringstream::~stringstream((stringstream *)&debugStream);
LAB_00104c90:
  std::__cxx11::string::~string((string *)&portDescription);
  return iVar4;
}

Assistant:

int main(int argc, char** argv)
{
    int i;
    int board = 0;

    std::string portDescription = BasePort::DefaultPort();

    if (argc > 1) {
        int args_found = 0;
        for (i = 1; i < argc; i++) {
            if (argv[i][0] == '-') {
                if (argv[i][1] == 'p') {
                    portDescription = argv[i]+2;
                }
                else {
                    std::cerr << "Usage: instrument <board-num> [-pP]" << std::endl
                              << "       where <board-num> = rotary switch setting (0-15)" << std::endl
                              << "             P = port number (default 0)" << std::endl
                              << "       can also specify -pfwP, -pethP or -pudp" << std::endl;
                    return 0;
                }
            }
            else {
                if (args_found == 0)
                    board = atoi(argv[i]);
                args_found++;
            }
        }
    }

    std::stringstream debugStream(std::stringstream::out|std::stringstream::in);
    BasePort *Port = PortFactory(portDescription.c_str(), debugStream);
    if (!Port) {
        PrintDebugStream(debugStream);
        std::cerr << "Failed to create port using: " << portDescription << std::endl;
        return -1;
    }
    if (!Port->IsOK()) {
        PrintDebugStream(debugStream);
        std::cerr << "Failed to initialize " << Port->GetPortTypeString() << std::endl;
        return -1;
    }

    AmpIO Board(board);
    Port->AddBoard(&Board);

    uint32_t fver = Board.GetFirmwareVersion();
    if (fver < 7) {
        std::cerr << "Instrument read requires firmware version 7+ (detected version " << fver << ")" << std::endl;
        Port->RemoveBoard(board);
        delete Port;
        return -1;
    }
    uint32_t status = Board.ReadStatus();

    // Now, we try to read the Dallas chip. This will also populate the status field.
    unsigned char buffer[2048];  // Buffer for entire contents of DS2505 memory (2 Kbytes)
    bool ret = Board.DallasReadMemory(0, (unsigned char *) buffer, sizeof(buffer));
    if (!Board.DallasReadStatus(status)) {
        std::cerr << "Failed to read DS2505 status" << std::endl;
        Port->RemoveBoard(board);
        delete Port;
        return -1;
    }
    // No longer need these
    Port->RemoveBoard(board);
    delete Port;
    if ((status & 0x00000001) != 0x00000001) {
        std::cerr << "DS2505 interface not enabled (hardware problem)" << std::endl;
        return -1;
    }
    unsigned char ds_reset = static_cast<unsigned char>((status & 0x00000006)>>1);
    if (ds_reset != 1) {
        std::cerr << "Failed to communicate with DS2505" << std::endl;
        if (ds_reset == 2)
            std::cerr << "  - DOUT3 did not reach high state -- is pullup resistor missing?" << std::endl;
        else if (ds_reset == 3)
            std::cerr << "  - Did not received ACK from DS2505 -- is dMIB signal jumpered?" << std::endl;
        return -1;
    }
    unsigned char family_code = static_cast<unsigned char>((status&0xFF000000)>>24);
    if (family_code != 0x0B) {
        std::cerr << "Unknown device family code: 0x" << std::hex << static_cast<unsigned int>(family_code)
                  << " (DS2505 should be 0x0B)" << std::endl;
        return -1;
    }
    bool useDS2480B = (status & 0x00008000) == 0x00008000;
    if (!useDS2480B) {
        unsigned char rise_time = static_cast<unsigned char>((status&0x00FF0000)>>16);
        std::cout << "Measured rise time: " << (rise_time/49.152) << " microseconds" << std::endl;
    }
    if (!ret) {
        std::cerr << "Failed to read instrument memory" << std::endl;
        return -1;
    }
    std::ofstream outFile("instrument.txt", std::ios::binary);
    if (outFile.good()) {
        outFile.write((char *)buffer, sizeof(buffer));
        std::cout << "Data written to instrument.txt" << std::endl;
    }
    else {
        std::cerr << "Failed to open instrument.txt for writing" << std::endl;
        return -1;
    }
    outFile.close();
    return 0;
}